

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

SUNErrCode N_VBufPack_ManyVector(N_Vector x,void *buf)

{
  long in_RSI;
  long *in_RDI;
  sunindextype i;
  sunindextype offset;
  void *loc;
  SUNContext_conflict sunctx_local_scope_;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  long *local_8;
  
  local_18 = in_RDI[2];
  local_20 = in_RSI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < *(long *)*local_8; local_30 = local_30 + 1) {
    N_VBufPack(*(undefined8 *)(*(long *)(*local_8 + 0x10) + local_30 * 8),local_20);
    N_VBufSize(*(undefined8 *)(*(long *)(*local_8 + 0x10) + local_30 * 8),&local_28);
    local_20 = local_10 + local_28;
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VBufPack)(N_Vector x, void* buf)
{
  SUNFunctionBegin(x->sunctx);
  void* loc;           /* location in output buffer */
  sunindextype offset; /* subvector buffer offset   */
  sunindextype i;

  SUNAssert(buf, SUN_ERR_ARG_CORRUPT);

  /* start at the beginning of the output buffer */
  loc = buf;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* pack the output buffer starting at the given buffer location */
    SUNCheckCall(N_VBufPack(MANYVECTOR_SUBVEC(x, i), loc));

    /* get the offset from this subvector */
    SUNCheckCall(N_VBufSize(MANYVECTOR_SUBVEC(x, i), &offset));

    /* update the buffer location for the next vector */
    loc = (char*)buf + offset;
  }

  return SUN_SUCCESS;
}